

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void __thiscall
ImGuiInputTextCallbackData::DeleteChars(ImGuiInputTextCallbackData *this,int pos,int bytes_count)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  
  if (this->BufTextLen < bytes_count + pos) {
    __assert_fail("pos + bytes_count <= BufTextLen",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_widgets.cpp"
                  ,0xd42,"void ImGuiInputTextCallbackData::DeleteChars(int, int)");
  }
  pcVar3 = this->Buf + pos;
  pcVar4 = pcVar3 + bytes_count;
  do {
    cVar1 = *pcVar4;
    if (cVar1 != '\0') {
      *pcVar3 = cVar1;
      pcVar3 = pcVar3 + 1;
    }
    pcVar4 = pcVar4 + 1;
  } while (cVar1 != '\0');
  *pcVar3 = '\0';
  iVar2 = this->CursorPos;
  if (iVar2 + bytes_count < pos) {
    if (iVar2 < pos) goto LAB_00168398;
  }
  else {
    pos = iVar2 - bytes_count;
  }
  this->CursorPos = pos;
LAB_00168398:
  this->SelectionEnd = this->CursorPos;
  this->SelectionStart = this->CursorPos;
  this->BufDirty = true;
  this->BufTextLen = this->BufTextLen - bytes_count;
  return;
}

Assistant:

void ImGuiInputTextCallbackData::DeleteChars(int pos, int bytes_count)
{
    IM_ASSERT(pos + bytes_count <= BufTextLen);
    char* dst = Buf + pos;
    const char* src = Buf + pos + bytes_count;
    while (char c = *src++)
        *dst++ = c;
    *dst = '\0';

    if (CursorPos + bytes_count >= pos)
        CursorPos -= bytes_count;
    else if (CursorPos >= pos)
        CursorPos = pos;
    SelectionStart = SelectionEnd = CursorPos;
    BufDirty = true;
    BufTextLen -= bytes_count;
}